

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapchainImage.cpp
# Opt level: O1

vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
* myvk::SwapchainImage::Create
            (vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
             *__return_storage_ptr__,Ptr<Swapchain> *swapchain)

{
  element_type *peVar1;
  VkExtent2D VVar2;
  pointer psVar3;
  PFN_vkGetSwapchainImagesKHR p_Var4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar6;
  ulong uVar7;
  uint32_t image_count;
  shared_ptr<myvk::SwapchainImage> ptr;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> images;
  uint local_60;
  undefined1 local_59;
  long local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> local_48;
  
  p_Var4 = vkGetSwapchainImagesKHR;
  iVar5 = (*(((swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_DeviceObjectBase).super_Base._vptr_Base[2])();
  (*p_Var4)(*(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar5) + 0x268),
            ((swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            m_swapchain,&local_60,(VkImage *)0x0);
  std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>::vector
            (&local_48,(ulong)local_60,(allocator_type *)&local_58);
  p_Var4 = vkGetSwapchainImagesKHR;
  iVar5 = (*(((swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_DeviceObjectBase).super_Base._vptr_Base[2])();
  (*p_Var4)(*(VkDevice *)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x268),
            ((swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            m_swapchain,&local_60,
            local_48.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
            super__Vector_impl_data._M_start);
  std::
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ::vector(__return_storage_ptr__,(ulong)local_60,(allocator_type *)&local_58);
  if (local_60 != 0) {
    lVar6 = 8;
    uVar7 = 0;
    do {
      std::__shared_ptr<myvk::SwapchainImage,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<myvk::SwapchainImage>>
                ((__shared_ptr<myvk::SwapchainImage,(__gnu_cxx::_Lock_policy)2> *)&local_58,
                 (allocator<myvk::SwapchainImage> *)&local_59);
      *(element_type **)(local_58 + 0x40) =
           (swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x48),
                 &(swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
      *(VkImage *)(local_58 + 0x18) =
           local_48.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7];
      peVar1 = (swapchain->super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      *(VkImageUsageFlags *)(local_58 + 0x20) = (peVar1->m_swapchain_create_info).imageUsage;
      VVar2 = (peVar1->m_swapchain_create_info).imageExtent;
      *(uint32_t *)(local_58 + 0x24) = VVar2.width;
      *(uint32_t *)(local_58 + 0x28) = VVar2.height;
      *(undefined8 *)(local_58 + 0x2c) = 0x100000000;
      *(VkFormat *)(local_58 + 0x34) = (peVar1->m_swapchain_create_info).imageFormat;
      *(undefined8 *)(local_58 + 0x38) = 0x100000001;
      psVar3 = (__return_storage_ptr__->
               super__Vector_base<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      *(long *)((long)psVar3 + lVar6 + -8) = local_58;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(psVar3->
                         super___shared_ptr<myvk::SwapchainImage,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr + lVar6),&local_50);
      if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 < local_60);
  }
  if (local_48.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
      super__Vector_impl_data._M_start != (VkImage *)0x0) {
    operator_delete(local_48.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Ptr<SwapchainImage>> SwapchainImage::Create(const Ptr<Swapchain> &swapchain) {
	uint32_t image_count;
	vkGetSwapchainImagesKHR(swapchain->GetDevicePtr()->GetHandle(), swapchain->GetHandle(), &image_count, nullptr);
	std::vector<VkImage> images(image_count);
	vkGetSwapchainImagesKHR(swapchain->GetDevicePtr()->GetHandle(), swapchain->GetHandle(), &image_count,
	                        images.data());

	std::vector<Ptr<SwapchainImage>> ret(image_count);
	for (uint32_t i = 0; i < image_count; ++i) {
		auto ptr = std::make_shared<SwapchainImage>();
		ptr->m_swapchain_ptr = swapchain;
		ptr->m_image = images[i];

		ptr->m_usage = swapchain->GetImageUsage();
		ptr->m_extent = {swapchain->GetExtent().width, swapchain->GetExtent().height};
		ptr->m_type = VK_IMAGE_TYPE_2D;
		ptr->m_format = swapchain->GetImageFormat();
		ptr->m_mip_levels = 1;
		ptr->m_array_layers = 1;
		ret[i] = ptr;
	}
	return ret;
}